

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

void Bac_ManFree(Bac_Man_t *p)

{
  Bac_Ntk_t *pBVar1;
  void *__ptr;
  long lVar2;
  int i;
  long lVar3;
  
  lVar2 = 0xf0;
  for (lVar3 = 1; lVar3 <= p->nNtks; lVar3 = lVar3 + 1) {
    pBVar1 = p->pNtks;
    Vec_IntErase((Vec_Int_t *)((long)&pBVar1->pDesign + lVar2));
    Vec_IntErase((Vec_Int_t *)((long)&pBVar1->iBoxNtk + lVar2));
    Vec_IntErase((Vec_Int_t *)((long)&(pBVar1->vInputs).nCap + lVar2));
    __ptr = *(void **)((long)&(pBVar1->vOutputs).pArray + lVar2);
    if (__ptr != (void *)0x0) {
      free(__ptr);
      *(undefined8 *)((long)&(pBVar1->vOutputs).pArray + lVar2) = 0;
    }
    *(undefined8 *)((long)&(pBVar1->vOutputs).nCap + lVar2) = 0;
    Vec_IntErase((Vec_Int_t *)((long)&(pBVar1->vInfo).nCap + lVar2));
    Vec_IntErase((Vec_Int_t *)((long)&(pBVar1->vType).nCap + lVar2));
    Vec_IntErase((Vec_Int_t *)((long)&(pBVar1->vFanin).nCap + lVar2));
    Vec_IntErase((Vec_Int_t *)((long)&(pBVar1->vIndex).nCap + lVar2));
    Vec_IntErase((Vec_Int_t *)((long)&(pBVar1->vName).nCap + lVar2));
    Vec_IntErase((Vec_Int_t *)((long)&(pBVar1->vFanout).nCap + lVar2));
    Vec_IntErase((Vec_Int_t *)((long)&(pBVar1->vCopy).nCap + lVar2));
    lVar2 = lVar2 + 0xd0;
  }
  Vec_IntErase(&p->vBuf2LeafNtk);
  Vec_IntErase(&p->vBuf2LeafObj);
  Vec_IntErase(&p->vBuf2RootNtk);
  Vec_IntErase(&p->vBuf2RootObj);
  Abc_NamDeref(p->pStrs);
  Abc_NamDeref(p->pMods);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  free(p->pNtks);
  free(p);
  return;
}

Assistant:

static inline void Bac_ManFree( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkFree( pNtk );
    Vec_IntErase( &p->vBuf2LeafNtk );
    Vec_IntErase( &p->vBuf2LeafObj );
    Vec_IntErase( &p->vBuf2RootNtk );
    Vec_IntErase( &p->vBuf2RootObj );
    Abc_NamDeref( p->pStrs );
    Abc_NamDeref( p->pMods );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p->pNtks );
    ABC_FREE( p );
}